

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O1

void out_int_formatted(int i)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::cout;
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) | 0x200;
  *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t(decimal)\n",0xb);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t(octal)\n",9);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t(hexadecimal)\n",0xf);
  return;
}

Assistant:

void out_int_formatted(int i)
{
	std::cout << std::showbase;
	std::cout << std::dec << i << "\t(decimal)\n"
		<< std::oct << i << "\t(octal)\n"
		<< std::hex << i << "\t(hexadecimal)\n";
}